

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.cpp
# Opt level: O0

int main(void)

{
  element_type *this;
  anon_class_1_0_00000001 local_181;
  BoolFunctor local_180;
  anon_class_1_0_00000001 local_159;
  ConnCallback local_158;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108;
  undefined1 local_e8 [8];
  shared_ptr<Liby::TcpServer> echo_server;
  string local_c0;
  undefined1 local_a0 [8];
  EventLoopGroup group;
  
  group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"EPOLL",(allocator *)&stack0xffffffffffffff3f);
  Liby::EventLoopGroup::EventLoopGroup((EventLoopGroup *)local_a0,4,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"localhost",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"9377",&local_131);
  Liby::EventLoopGroup::creatTcpServer((EventLoopGroup *)local_e8,(string *)local_a0,&local_108);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  this = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_e8);
  std::function<void(Liby::Connection&)>::function<main::__0,void>
            ((function<void(Liby::Connection&)> *)&local_158,&local_159);
  Liby::TcpServer::onRead(this,&local_158);
  std::function<void_(Liby::Connection_&)>::~function(&local_158);
  std::function<bool()>::
  function<Liby::EventLoopGroup::run(std::function<bool()>)::_default_arg_1_::_lambda()_1_,void>
            ((function<bool()> *)&local_180,&local_181);
  Liby::EventLoopGroup::run((EventLoopGroup *)local_a0,&local_180);
  std::function<bool_()>::~function(&local_180);
  group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::shared_ptr<Liby::TcpServer>::~shared_ptr((shared_ptr<Liby::TcpServer> *)local_e8);
  Liby::EventLoopGroup::~EventLoopGroup((EventLoopGroup *)local_a0);
  return group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main(void) {
    EventLoopGroup group(4, "EPOLL");
    auto echo_server = group.creatTcpServer("localhost", "9377");
    echo_server->onRead([](Connection &conn) { conn.send(conn.read()); });
    group.run();
    return 0;
}